

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.cpp
# Opt level: O3

void __thiscall index::set_word_end(index *this,wstring *word)

{
  _Node_iterator_base<std::pair<const_wchar_t,_character>,_false> _Var1;
  pair<std::__detail::_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false>_>
  pVar2;
  
  pVar2 = std::
          _Hashtable<wchar_t,_std::pair<const_wchar_t,_character>,_std::allocator<std::pair<const_wchar_t,_character>_>,_std::__detail::_Select1st,_std::equal_to<wchar_t>,_std::hash<wchar_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
          ::equal_range((_Hashtable<wchar_t,_std::pair<const_wchar_t,_character>,_std::allocator<std::pair<const_wchar_t,_character>_>,_std::__detail::_Select1st,_std::equal_to<wchar_t>,_std::hash<wchar_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                         *)this,(word->_M_dataplus)._M_p + (this->level_ - 1));
  for (_Var1._M_cur = (__node_type *)
                      pVar2.first.
                      super__Node_iterator_base<std::pair<const_wchar_t,_character>,_false>._M_cur;
      (_Node_iterator_base<std::pair<const_wchar_t,_character>,_false>)_Var1._M_cur !=
      pVar2.second.super__Node_iterator_base<std::pair<const_wchar_t,_character>,_false>._M_cur.
      super__Node_iterator_base<std::pair<const_wchar_t,_character>,_false>;
      _Var1._M_cur = (__node_type *)((_Var1._M_cur)->super__Hash_node_base)._M_nxt) {
    if (*(wchar_t *)
         ((long)&((_Var1._M_cur)->super__Hash_node_value<std::pair<const_wchar_t,_character>,_false>
                 ).super__Hash_node_value_base<std::pair<const_wchar_t,_character>_>._M_storage.
                 _M_storage + 8) == (word->_M_dataplus)._M_p[this->level_]) {
      ((_Var1._M_cur)->super__Hash_node_value<std::pair<const_wchar_t,_character>,_false>).
      super__Hash_node_value_base<std::pair<const_wchar_t,_character>_>._M_storage._M_storage.__data
      [0xc] = '\x01';
      std::__cxx11::wstring::_M_assign
                ((wstring *)
                 (((_Var1._M_cur)->
                  super__Hash_node_value<std::pair<const_wchar_t,_character>,_false>).
                  super__Hash_node_value_base<std::pair<const_wchar_t,_character>_>._M_storage.
                  _M_storage.__data + 0x10));
    }
  }
  return;
}

Assistant:

void index::set_word_end(const std::wstring& word)
{
    auto range = index_.equal_range(word[level_ - 1]);
    for (auto iter = range.first; iter != range.second; ++iter)
    {
        if (iter->second.value == word[level_])
        {
            iter->second.is_word_end = true;
            iter->second.word = word;
        }
    }
}